

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

void __thiscall
capnp::DynamicList::Builder::adopt(Builder *this,uint index,Orphan<capnp::DynamicValue> *orphan)

{
  StructBuilder other;
  bool bVar1;
  Which WVar2;
  StructSize size;
  StructSchema SVar3;
  InterfaceSchema other_00;
  Fault f;
  ListSchema elementType;
  Schema in_stack_ffffffffffffff28;
  Reader local_a8;
  Type local_60;
  StructBuilder local_50;
  
  WVar2 = LIST;
  if ((this->schema).elementType.listDepth == '\0') {
    WVar2 = (this->schema).elementType.baseType;
  }
  switch(WVar2) {
  case VOID:
  case BOOL:
  case INT8:
  case INT16:
  case INT32:
  case INT64:
  case UINT8:
  case UINT16:
  case UINT32:
  case UINT64:
  case FLOAT32:
  case FLOAT64:
  case ENUM:
    Orphan<capnp::DynamicValue>::getReader(&local_a8,orphan);
    set(this,index,&local_a8);
    DynamicValue::Reader::~Reader(&local_a8);
    return;
  case TEXT:
    if (orphan->type != TEXT) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                ((Fault *)&local_a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x529,FAILED,"orphan.getType() == DynamicValue::TEXT","\"Value type mismatch.\"",
                 (char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::fatal((Fault *)&local_a8);
    }
    break;
  case DATA:
    if (orphan->type != DATA) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                ((Fault *)&local_a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x52e,FAILED,"orphan.getType() == DynamicValue::DATA","\"Value type mismatch.\"",
                 (char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::fatal((Fault *)&local_a8);
    }
    break;
  case LIST:
    local_60 = (Type)Type::asList((Type *)this);
    if ((orphan->type != LIST) ||
       (bVar1 = Type::operator==((Type *)&(orphan->field_1).enumValue,&local_60), !bVar1)) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                ((Fault *)&local_a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x535,FAILED,
                 "orphan.getType() == DynamicValue::LIST && orphan.listSchema == elementType",
                 "\"Value type mismatch.\"",(char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::fatal((Fault *)&local_a8);
    }
    break;
  case STRUCT:
    SVar3 = Type::asStruct((Type *)this);
    if ((orphan->type == STRUCT) &&
       ((RawBrandedSchema *)(orphan->field_1).intValue == SVar3.super_Schema.raw)) {
      _::ListBuilder::getStructElement((StructBuilder *)&local_a8,&this->builder,index);
      size = anon_unknown_71::structSizeFromSchema((StructSchema)in_stack_ffffffffffffff28.raw);
      _::OrphanBuilder::asStruct(&local_50,&orphan->builder,size);
      other.capTable = local_50.capTable;
      other.segment = local_50.segment;
      other.data = local_50.data;
      other.pointers = local_50.pointers;
      other.dataSize = local_50.dataSize;
      other.pointerCount = local_50.pointerCount;
      other._38_2_ = local_50._38_2_;
      _::StructBuilder::transferContentFrom((StructBuilder *)&local_a8,other);
      return;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
              ((Fault *)&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x53d,FAILED,
               "orphan.getType() == DynamicValue::STRUCT && orphan.structSchema == elementType",
               "\"Value type mismatch.\"",(char (*) [21])"Value type mismatch.");
    kj::_::Debug::Fault::fatal((Fault *)&local_a8);
  case INTERFACE:
    other_00 = Type::asInterface((Type *)this);
    if ((orphan->type != CAPABILITY) ||
       (bVar1 = InterfaceSchema::extends(&(orphan->field_1).interfaceSchema,other_00), !bVar1)) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                ((Fault *)&local_a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x54a,FAILED,
                 "orphan.getType() == DynamicValue::CAPABILITY && orphan.interfaceSchema.extends(elementType)"
                 ,"\"Value type mismatch.\"",(char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::fatal((Fault *)&local_a8);
    }
    break;
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              ((Fault *)&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x544,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
               (char (*) [32])"List(AnyPointer) not supported.");
    kj::_::Debug::Fault::fatal((Fault *)&local_a8);
  default:
    kj::_::unreachable();
  }
  local_a8.field_1.structValue.reader.segment =
       (SegmentReader *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
  local_a8._0_8_ = (this->builder).segment;
  local_a8.field_1.intValue = (int64_t)(this->builder).capTable;
  _::PointerBuilder::adopt((PointerBuilder *)&local_a8,&orphan->builder);
  return;
}

Assistant:

void DynamicList::Builder::adopt(uint index, Orphan<DynamicValue>&& orphan) {
  switch (schema.whichElementType()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::ENUM:
      set(index, orphan.getReader());
      return;

    case schema::Type::TEXT:
      KJ_REQUIRE(orphan.getType() == DynamicValue::TEXT, "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;

    case schema::Type::DATA:
      KJ_REQUIRE(orphan.getType() == DynamicValue::DATA, "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;

    case schema::Type::LIST: {
      ListSchema elementType = schema.getListElementType();
      KJ_REQUIRE(orphan.getType() == DynamicValue::LIST && orphan.listSchema == elementType,
                 "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;
    }

    case schema::Type::STRUCT: {
      auto elementType = schema.getStructElementType();
      KJ_REQUIRE(orphan.getType() == DynamicValue::STRUCT && orphan.structSchema == elementType,
                 "Value type mismatch.");
      builder.getStructElement(bounded(index) * ELEMENTS).transferContentFrom(
          orphan.builder.asStruct(structSizeFromSchema(elementType)));
      return;
    }

    case schema::Type::ANY_POINTER:
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.");

    case schema::Type::INTERFACE: {
      auto elementType = schema.getInterfaceElementType();
      KJ_REQUIRE(orphan.getType() == DynamicValue::CAPABILITY &&
                 orphan.interfaceSchema.extends(elementType),
                 "Value type mismatch.");
      builder.getPointerElement(bounded(index) * ELEMENTS).adopt(kj::mv(orphan.builder));
      return;
    }
  }

  KJ_UNREACHABLE;
}